

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_NODE pRVar3;
  REF_AGENTS ref_agents;
  REF_CELL pRVar4;
  REF_AGENT_STRUCT *pRVar5;
  REF_ADJ pRVar6;
  REF_BOOL *pRVar7;
  REF_DBL *pRVar8;
  uint uVar9;
  long lVar10;
  REF_INT RVar11;
  ulong uVar12;
  undefined8 uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  REF_MPI ref_mpi;
  REF_INT n_agents;
  uint local_64;
  uint local_60;
  REF_INT local_5c;
  REF_NODE local_58;
  uint local_4c;
  REF_MPI local_48;
  REF_CELL local_40;
  REF_NODE local_38;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar2 = ref_interp->from_grid->node;
  pRVar3 = ref_interp->to_grid->node;
  ref_agents = ref_interp->ref_agents;
  pRVar4 = (&ref_interp->from_tet)[ref_interp->from_grid->twod != 0];
  local_5c = ref_agents->n;
  uVar9 = ref_mpi_allsum(ref_mpi,&local_5c,1,1);
  if (uVar9 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x35c,
           "ref_interp_process_agents",(ulong)uVar9,"sum");
    return uVar9;
  }
  local_4c = 0;
  local_64 = 0;
  local_58 = pRVar3;
  local_40 = pRVar4;
  local_38 = pRVar2;
  do {
    if (local_5c < 1) {
      uVar9 = ref_mpi_allsum(ref_mpi,&ref_interp->walk_steps,1,1);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3b6,"ref_interp_process_agents",(ulong)uVar9,"sum");
        return uVar9;
      }
      uVar9 = ref_mpi_allsum(ref_mpi,&ref_interp->n_walk,1,1);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3b7,"ref_interp_process_agents",(ulong)uVar9,"sum");
        return uVar9;
      }
      uVar9 = ref_mpi_allsum(ref_mpi,&ref_interp->n_terminated,1,1);
      if (uVar9 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x3b9,"ref_interp_process_agents",(ulong)uVar9,"sum");
        return uVar9;
      }
      local_60 = 0;
      if (local_58->max < 1) {
        return 0;
      }
      do {
        if (((-1 < (int)local_60) && (uVar12 = (ulong)local_60, -1 < local_58->global[uVar12])) &&
           (local_58->ref_mpi->id == local_58->part[uVar12])) {
          iVar1 = ref_interp->agent_hired[uVar12];
          if ((long)iVar1 != 0) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3bd,"ref_interp_process_agents","should be done",0,(long)iVar1);
            local_64 = 1;
          }
          if (iVar1 != 0) {
            return local_64;
          }
        }
        local_60 = local_60 + 1;
        if (local_58->max <= (int)local_60) {
          return 0;
        }
      } while( true );
    }
    if ((ref_interp->instrument != 0) && (ref_interp->ref_mpi->id == 0)) {
      printf(" %2d sweep",(ulong)local_4c);
    }
    if (ref_interp->instrument != 0) {
      ref_agents_population(ref_agents,"agent pop");
    }
    if (0 < ref_agents->max) {
      lVar16 = 0;
      lVar15 = 0;
      do {
        if (((*(int *)((long)ref_agents->agent->xyz + lVar16 + -0x30) == 1) &&
            (*(int *)((long)ref_agents->agent->xyz + lVar16 + -0x1c) == ref_mpi->id)) &&
           (uVar9 = ref_interp_walk_agent(ref_interp,(REF_INT)lVar15), uVar9 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x367,"ref_interp_process_agents",(ulong)uVar9,"walking");
          return uVar9;
        }
        lVar15 = lVar15 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar15 < ref_agents->max);
    }
    uVar9 = ref_agents_migrate(ref_agents);
    if (uVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x36b,"ref_interp_process_agents",(ulong)uVar9,"send it");
      return uVar9;
    }
    if (0 < ref_agents->max) {
      lVar16 = 0;
      lVar15 = 0;
      do {
        pRVar5 = ref_agents->agent;
        if ((*(int *)((long)pRVar5->xyz + lVar16 + -0x30) == 3) &&
           (*(int *)((long)pRVar5->xyz + lVar16 + -0x1c) == ref_mpi->id)) {
          uVar9 = ref_node_local(local_38,*(REF_GLOB *)((long)pRVar5->xyz + lVar16 + -0x10),
                                 (REF_INT *)&local_60);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x371,"ref_interp_process_agents",(ulong)uVar9,"localize");
            return uVar9;
          }
          pRVar5 = ref_agents->agent;
          *(undefined4 *)((long)pRVar5->xyz + lVar16 + -0x30) = 1;
          RVar11 = -1;
          if (((-1 < (long)(int)local_60) &&
              (pRVar6 = local_40->ref_adj, (int)local_60 < pRVar6->nnode)) &&
             ((long)pRVar6->first[(int)local_60] != -1)) {
            RVar11 = pRVar6->item[pRVar6->first[(int)local_60]].ref;
          }
          *(REF_INT *)((long)pRVar5->xyz + lVar16 + -0x18) = RVar11;
        }
        lVar15 = lVar15 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar15 < ref_agents->max);
    }
    if (0 < ref_agents->max) {
      lVar16 = 0x20;
      lVar15 = 0;
      do {
        pRVar5 = ref_agents->agent;
        if ((*(int *)((long)pRVar5->xyz + lVar16 + -0x50) == 4) &&
           (*(int *)((long)pRVar5->xyz + lVar16 + -0x44) == ref_mpi->id)) {
          uVar9 = ref_node_local(local_58,*(REF_GLOB *)((long)pRVar5->xyz + lVar16 + -0x30),
                                 (REF_INT *)&local_60);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x37c,"ref_interp_process_agents",(ulong)uVar9,"localize");
            return uVar9;
          }
          if ((ref_interp->cell[(int)local_60] == -1) &&
             (pRVar7 = ref_interp->agent_hired, pRVar7[(int)local_60] == 0)) {
            pRVar5 = ref_interp->ref_agents->agent;
            *(undefined4 *)((long)pRVar5->xyz + lVar16 + -0x50) = 1;
            *(uint *)((long)pRVar5->xyz + lVar16 + -0x40) = local_60;
            *(undefined8 *)((long)pRVar5->xyz + lVar16 + -0x30) = 0xffffffffffffffff;
            pRVar7[(int)local_60] = 1;
          }
          else {
            uVar9 = ref_agents_remove(ref_interp->ref_agents,(REF_INT)lVar15);
            if (uVar9 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x37f,"ref_interp_process_agents",(ulong)uVar9,"already got one");
              return uVar9;
            }
          }
        }
        lVar15 = lVar15 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar15 < ref_agents->max);
    }
    if (0 < ref_agents->max) {
      lVar16 = 0;
      lVar15 = 0;
      do {
        pRVar5 = ref_agents->agent;
        if (((*(uint *)((long)pRVar5->xyz + lVar16 + -0x30) | 4) == 6) &&
           (*(int *)((long)pRVar5->xyz + lVar16 + -0x24) == ref_mpi->id)) {
          local_60 = *(uint *)((long)pRVar5->xyz + lVar16 + -0x20);
          lVar10 = (long)(int)local_60;
          if ((lVar10 < 0) || ((local_58->max <= (int)local_60 || (local_58->global[lVar10] < 0))))
          {
            pcVar14 = "not valid";
            uVar13 = 0x38e;
            goto LAB_00166c1c;
          }
          if (local_58->ref_mpi->id != local_58->part[lVar10]) {
            pcVar14 = "ghost, not owned";
            uVar13 = 0x38f;
            goto LAB_00166c1c;
          }
          iVar1 = ref_interp->cell[lVar10];
          if ((long)iVar1 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x390,"ref_interp_process_agents","already found?",0xffffffffffffffff,
                   (long)iVar1);
            local_64 = 1;
          }
          if (iVar1 != -1) {
            return local_64;
          }
          if (ref_interp->agent_hired[(int)local_60] == 0) {
            pcVar14 = "should have an agent";
            uVar13 = 0x391;
            goto LAB_00166c1c;
          }
          if (*(int *)((long)ref_agents->agent->xyz + lVar16 + -0x30) == 6) {
            ref_interp->walk_steps =
                 *(int *)((long)ref_agents->agent->xyz + lVar16 + -8) + ref_interp->walk_steps + 1;
            ref_interp->n_terminated = ref_interp->n_terminated + 1;
          }
          ref_interp->agent_hired[(int)local_60] = 0;
          uVar9 = ref_agents_remove(ref_agents,(REF_INT)lVar15);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x397,"ref_interp_process_agents",(ulong)uVar9,"no longer needed");
            return uVar9;
          }
        }
        lVar15 = lVar15 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar15 < ref_agents->max);
    }
    if (0 < ref_agents->max) {
      lVar16 = 0x48;
      lVar15 = 0;
      local_48 = ref_mpi;
      do {
        pRVar5 = ref_agents->agent;
        if ((pRVar5[lVar15].mode == REF_AGENT_ENCLOSING) && (pRVar5[lVar15].home == ref_mpi->id)) {
          local_60 = pRVar5[lVar15].node;
          lVar10 = (long)(int)local_60;
          if ((lVar10 < 0) || ((local_58->max <= (int)local_60 || (local_58->global[lVar10] < 0))))
          {
            pcVar14 = "not valid";
            uVar13 = 0x39f;
LAB_00166c1c:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar13,"ref_interp_process_agents",pcVar14);
            return 1;
          }
          if (local_58->ref_mpi->id != local_58->part[lVar10]) {
            pcVar14 = "ghost, not owned";
            uVar13 = 0x3a0;
            goto LAB_00166c1c;
          }
          iVar1 = ref_interp->cell[lVar10];
          if ((long)iVar1 != -1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3a1,"ref_interp_process_agents","already found?",0xffffffffffffffff,
                   (long)iVar1);
            local_64 = 1;
          }
          if (iVar1 != -1) {
            return local_64;
          }
          pRVar7 = ref_interp->agent_hired;
          if (pRVar7[(int)local_60] == 0) {
            pcVar14 = "should have an agent";
            uVar13 = 0x3a2;
            goto LAB_00166c1c;
          }
          pRVar5 = ref_agents->agent;
          ref_interp->cell[(int)local_60] = pRVar5[lVar15].seed;
          ref_interp->part[(int)local_60] = pRVar5[lVar15].part;
          pRVar8 = ref_interp->bary;
          lVar10 = 0;
          do {
            pRVar8[(long)(int)local_60 * 4 + lVar10] =
                 *(REF_DBL *)((long)pRVar5->xyz + lVar10 * 8 + lVar16 + -0x30);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          ref_interp->walk_steps = pRVar5[lVar15].step + ref_interp->walk_steps + 1;
          ref_interp->n_walk = ref_interp->n_walk + 1;
          pRVar7[(int)local_60] = 0;
          uVar9 = ref_agents_remove(ref_agents,(REF_INT)lVar15);
          ref_mpi = local_48;
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3ac,"ref_interp_process_agents",(ulong)uVar9,"no longer needed");
            return uVar9;
          }
          uVar9 = ref_interp_push_onto_queue(ref_interp,local_60);
          if (uVar9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x3ad,"ref_interp_process_agents",(ulong)uVar9,"push");
            return uVar9;
          }
        }
        lVar15 = lVar15 + 1;
        lVar16 = lVar16 + 0x68;
      } while (lVar15 < ref_agents->max);
    }
    local_5c = ref_agents->n;
    uVar9 = ref_mpi_allsum(ref_mpi,&local_5c,1,1);
    if (uVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x3b2,"ref_interp_process_agents",(ulong)uVar9,"sum");
      local_64 = uVar9;
    }
    local_4c = local_4c + 1;
    if (uVar9 != 0) {
      return local_64;
    }
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_interp_process_agents(REF_INTERP ref_interp) {
  REF_NODE from_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_CELL from_cell;
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT i, id, node;
  REF_INT n_agents;
  REF_INT sweep = 0;

  if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  n_agents = ref_agents_n(ref_agents);
  RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");

  while (n_agents > 0) {
    if (ref_interp->instrument && ref_mpi_once(ref_interp->ref_mpi))
      printf(" %2d sweep", sweep);
    if (ref_interp->instrument) ref_agents_population(ref_agents, "agent pop");
    sweep++;

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_WALKING == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_interp_walk_agent(ref_interp, id), "walking");
      }
    }

    RSS(ref_agents_migrate(ref_agents), "send it");

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_HOP_PART == ref_agent_mode(ref_agents, id) &&
          ref_agent_part(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(from_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
        /* pick best from orbit? */
        ref_agent_seed(ref_agents, id) = ref_cell_first_with(from_cell, node);
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_SUGGESTION == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        RSS(ref_node_local(to_node, ref_agent_global(ref_agents, id), &node),
            "localize");
        if (REF_EMPTY != ref_interp->cell[node] ||
            ref_interp->agent_hired[node]) {
          RSS(ref_agents_remove(ref_interp->ref_agents, id), "already got one");
        } else {
          ref_agent_mode(ref_interp->ref_agents, id) = REF_AGENT_WALKING;
          ref_agent_node(ref_interp->ref_agents, id) = node;
          ref_agent_global(ref_interp->ref_agents, id) = REF_EMPTY;
          ref_interp->agent_hired[node] = REF_TRUE;
        }
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if ((REF_AGENT_AT_BOUNDARY == ref_agent_mode(ref_agents, id) ||
           REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");
        if (REF_AGENT_TERMINATED == ref_agent_mode(ref_agents, id)) {
          (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
          (ref_interp->n_terminated)++;
        }
        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
      }
    }

    each_active_ref_agent(ref_agents, id) {
      if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id) &&
          ref_agent_home(ref_agents, id) == ref_mpi_rank(ref_mpi)) {
        node = ref_agent_node(ref_agents, id);
        RAS(ref_node_valid(to_node, node), "not valid");
        RAS(ref_node_owned(to_node, node), "ghost, not owned");
        REIS(REF_EMPTY, ref_interp->cell[node], "already found?");
        RAS(ref_interp->agent_hired[node], "should have an agent");

        ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
        ref_interp->part[node] = ref_agent_part(ref_agents, id);
        for (i = 0; i < 4; i++)
          ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
        (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
        (ref_interp->n_walk)++;

        ref_interp->agent_hired[node] = REF_FALSE; /* but no more */
        RSS(ref_agents_remove(ref_agents, id), "no longer needed");
        RSS(ref_interp_push_onto_queue(ref_interp, node), "push");
      }
    }

    n_agents = ref_agents_n(ref_agents);
    RSS(ref_mpi_allsum(ref_mpi, &n_agents, 1, REF_INT_TYPE), "sum");
  }

  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->walk_steps), 1, REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_walk), 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_allsum(ref_mpi, &(ref_interp->n_terminated), 1, REF_INT_TYPE),
      "sum");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node))
      REIS(REF_FALSE, ref_interp->agent_hired[node], "should be done");
  }

  return REF_SUCCESS;
}